

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCanon.c
# Opt level: O1

Ivy_Obj_t * Ivy_CanonExor(Ivy_Man_t *p,Ivy_Obj_t *pObj0,Ivy_Obj_t *pObj1)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *pIVar2;
  int iVar3;
  
  pIVar1 = (Ivy_Obj_t *)((ulong)pObj1 & 0xfffffffffffffffe);
  if ((pIVar1 != (Ivy_Obj_t *)0x0) && (pIVar1->Id == 0)) {
    __assert_fail("p1 == NULL || !Ivy_ObjIsConst1(Ivy_Regular(p1))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                  ,0x138,
                  "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
                 );
  }
  pIVar2 = (Ivy_Obj_t *)((ulong)pObj0 & 0xfffffffffffffffe);
  if (pIVar2 != pIVar1) {
    *(uint *)&(p->Ghost).field_0x8 = *(uint *)&(p->Ghost).field_0x8 & 0xfffff9f0 | 6;
    (p->Ghost).pFanin0 = pIVar2;
    (p->Ghost).pFanin1 = pIVar1;
    if (pIVar1 != (Ivy_Obj_t *)0x0) {
      if (pIVar2 == (Ivy_Obj_t *)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = pIVar2->Id;
      }
      if (pIVar1->Id < iVar3) {
        (p->Ghost).pFanin0 = pIVar1;
        (p->Ghost).pFanin1 = pIVar2;
      }
    }
    pIVar1 = Ivy_CanonPair_rec(p,&p->Ghost);
    return (Ivy_Obj_t *)((ulong)pIVar1 ^ (ulong)(((uint)pObj1 ^ (uint)pObj0) & 1));
  }
  __assert_fail("Type == IVY_PI || Ivy_Regular(p0) != Ivy_Regular(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivy.h"
                ,0x139,
                "Ivy_Obj_t *Ivy_ObjCreateGhost(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Ivy_Type_t, Ivy_Init_t)"
               );
}

Assistant:

Ivy_Obj_t * Ivy_CanonExor( Ivy_Man_t * p, Ivy_Obj_t * pObj0, Ivy_Obj_t * pObj1 )
{
    Ivy_Obj_t * pGhost, * pResult;
    int fCompl = Ivy_IsComplement(pObj0) ^ Ivy_IsComplement(pObj1);
    pObj0 = Ivy_Regular(pObj0);
    pObj1 = Ivy_Regular(pObj1);
    pGhost = Ivy_ObjCreateGhost( p, pObj0, pObj1, IVY_EXOR, IVY_INIT_NONE );
    pResult = Ivy_CanonPair_rec( p, pGhost );
    return Ivy_NotCond( pResult, fCompl );
}